

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
yy::parser::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  symbol_kind_type sVar1;
  symbol_type *that_local;
  state_type s_local;
  stack_symbol_type *this_local;
  
  basic_symbol<yy::parser::by_state>::basic_symbol
            (&this->super_basic_symbol<yy::parser::by_state>,s,
             &(that->super_basic_symbol<yy::parser::by_kind>).location);
  sVar1 = by_kind::kind((by_kind *)that);
  if ((sVar1 != S_IDENTIFIER) && (sVar1 != S_BRACKET_ARGUMENT)) {
    if (sVar1 == S_REF_OPEN) {
      value_type::move<ReferenceType>
                (&(this->super_basic_symbol<yy::parser::by_state>).value,
                 &(that->super_basic_symbol<yy::parser::by_kind>).value);
      goto LAB_00107e22;
    }
    if (2 < (uint)(sVar1 + ~S_REF_CLOSE)) {
      if (((((uint)(sVar1 + ~S_29_3) < 3) || ((uint)(sVar1 + ~S_argument) < 2)) ||
          (sVar1 == S_unquoted_argument)) || ((uint)(sVar1 + ~S_unquoted_element) < 2)) {
        value_type::move<unsigned_long>
                  (&(this->super_basic_symbol<yy::parser::by_state>).value,
                   &(that->super_basic_symbol<yy::parser::by_kind>).value);
      }
      goto LAB_00107e22;
    }
  }
  value_type::move<std::__cxx11::string>
            (&(this->super_basic_symbol<yy::parser::by_state>).value,
             &(that->super_basic_symbol<yy::parser::by_kind>).value);
LAB_00107e22:
  (that->super_basic_symbol<yy::parser::by_kind>).super_by_kind.kind_ = S_YYEMPTY;
  return;
}

Assistant:

parser::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.move< ReferenceType > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.move< std::size_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.move< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }